

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O1

void UnityAssertEqualStringLen
               (char *expected,char *actual,UNITY_UINT32 length,char *msg,UNITY_UINT lineNumber)

{
  long lVar1;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if (actual == (char *)0x0 || expected == (char *)0x0) {
      if (expected != actual) {
LAB_00107b08:
        Unity.CurrentTestFailed = 1;
      }
    }
    else if (length != 0) {
      lVar1 = 0;
      do {
        if ((expected[lVar1] == '\0') && (actual[lVar1] == '\0')) break;
        if (expected[lVar1] != actual[lVar1]) goto LAB_00107b08;
        lVar1 = lVar1 + 1;
      } while (length != (UNITY_UINT32)lVar1);
    }
    if (Unity.CurrentTestFailed != 0) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrintExpectedAndActualStringsLen(expected,actual,length);
      UnityAddMsgIfSpecified(msg);
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
  }
  return;
}

Assistant:

void UnityAssertEqualStringLen(const char* expected,
                               const char* actual,
                               const UNITY_UINT32 length,
                               const char* msg,
                               const UNITY_LINE_TYPE lineNumber)
{
    UNITY_UINT32 i;

    RETURN_IF_FAIL_OR_IGNORE;

    /* if both pointers not null compare the strings */
    if (expected && actual)
    {
        for (i = 0; (i < length) && (expected[i] || actual[i]); i++)
        {
            if (expected[i] != actual[i])
            {
                Unity.CurrentTestFailed = 1;
                break;
            }
        }
    }
    else
    { /* handle case of one pointers being null (if both null, test should pass) */
        if (expected != actual)
        {
            Unity.CurrentTestFailed = 1;
        }
    }

    if (Unity.CurrentTestFailed)
    {
        UnityTestResultsFailBegin(lineNumber);
        UnityPrintExpectedAndActualStringsLen(expected, actual, length);
        UnityAddMsgIfSpecified(msg);
        UNITY_FAIL_AND_BAIL;
    }
}